

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void __thiscall
dxil_spv::CFGNode::retarget_fake_succ(CFGNode *this,CFGNode *to_prev,CFGNode *to_next)

{
  pointer *pppCVar1;
  CFGNode **ppCVar2;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  _Var3;
  __normal_iterator<dxil_spv::CFGNode_**,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
  __dest;
  CFGNode **__src;
  CFGNode *local_28;
  CFGNode *local_20;
  CFGNode *local_18;
  
  local_28 = to_next;
  local_20 = to_prev;
  local_18 = this;
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                    ((to_prev->fake_pred).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (to_prev->fake_pred).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  if (_Var3._M_current ==
      (local_20->fake_pred).
      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("std::find(to_prev->fake_pred.begin(), to_prev->fake_pred.end(), this) != to_prev->fake_pred.end()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/node.cpp"
                  ,0x1fd,"void dxil_spv::CFGNode::retarget_fake_succ(CFGNode *, CFGNode *)");
  }
  _Var3 = std::
          __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                    ((this->fake_succ).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->fake_succ).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_28);
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                     ((this->fake_succ).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (this->fake_succ).
                      super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,&local_20);
  ppCVar2 = (this->fake_succ).
            super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != ppCVar2) {
    if (_Var3._M_current == ppCVar2) {
      *__dest._M_current = local_28;
      local_18 = this;
      _Var3 = std::
              __find_if<__gnu_cxx::__normal_iterator<dxil_spv::CFGNode**,std::vector<dxil_spv::CFGNode*,dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode*>>>,__gnu_cxx::__ops::_Iter_equals_val<dxil_spv::CFGNode*const>>
                        ((local_28->fake_pred).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (local_28->fake_pred).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
      if (_Var3._M_current !=
          (local_28->fake_pred).
          super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        __assert_fail("std::find(to_next->fake_pred.begin(), to_next->fake_pred.end(), this) == to_next->fake_pred.end()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/node.cpp"
                      ,0x208,"void dxil_spv::CFGNode::retarget_fake_succ(CFGNode *, CFGNode *)");
      }
    }
    else {
      __src = __dest._M_current + 1;
      if (__src != ppCVar2) {
        memmove(__dest._M_current,__src,(long)ppCVar2 - (long)__src);
      }
      pppCVar1 = &(this->fake_succ).
                  super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + -1;
    }
    add_unique_fake_pred(local_28,this);
    recompute_immediate_post_dominator(this);
    return;
  }
  __assert_fail("prev_itr != fake_succ.end()",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/node.cpp"
                ,0x200,"void dxil_spv::CFGNode::retarget_fake_succ(CFGNode *, CFGNode *)");
}

Assistant:

void CFGNode::retarget_fake_succ(CFGNode *to_prev, CFGNode *to_next)
{
	assert(std::find(to_prev->fake_pred.begin(), to_prev->fake_pred.end(), this) != to_prev->fake_pred.end());
	auto succ_itr = std::find(fake_succ.begin(), fake_succ.end(), to_next);
	auto prev_itr = std::find(fake_succ.begin(), fake_succ.end(), to_prev);
	assert(prev_itr != fake_succ.end());

	// It is valid to rewrite a fake succ to an existing one.
	// It's possible that we need to rewrite from one loop exit to another.

	if (succ_itr == fake_succ.end())
	{
		*prev_itr = to_next;
		assert(std::find(to_next->fake_pred.begin(), to_next->fake_pred.end(), this) == to_next->fake_pred.end());
	}
	else
	{
		// We can invalidate iterators since we break out immediately when rewriting a fake succ.
		fake_succ.erase(prev_itr);
	}

	to_next->add_unique_fake_pred(this);
	recompute_immediate_post_dominator();
}